

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void SwapUVPlane(uint8_t *src_uv,int src_stride_uv,uint8_t *dst_vu,int dst_stride_vu,int width,
                int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *SwapUVRow;
  int y;
  code *pcVar2;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  pcVar2 = SwapUVRow_C;
  local_24 = in_R9D;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_R9D < 0) {
    local_24 = -in_R9D;
    local_8 = in_RDI + (local_24 + -1) * in_ESI;
    local_c = -in_ESI;
  }
  local_20 = in_R8D;
  local_1c = in_ECX;
  if ((local_c == in_R8D * 2) && (in_ECX == in_R8D * 2)) {
    local_20 = local_24 * in_R8D;
    local_24 = 1;
    local_1c = 0;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = SwapUVRow_Any_SSSE3, (local_20 & 0xf) == 0)) {
    pcVar2 = SwapUVRow_SSSE3;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = SwapUVRow_Any_AVX2, (local_20 & 0x1f) == 0)) {
    pcVar2 = SwapUVRow_AVX2;
  }
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    (*pcVar2)(local_8,local_18,local_20);
    local_8 = local_8 + local_c;
    local_18 = local_18 + local_1c;
  }
  return;
}

Assistant:

LIBYUV_API
void SwapUVPlane(const uint8_t* src_uv,
                 int src_stride_uv,
                 uint8_t* dst_vu,
                 int dst_stride_vu,
                 int width,
                 int height) {
  int y;
  void (*SwapUVRow)(const uint8_t* src_uv, uint8_t* dst_vu, int width) =
      SwapUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uv = src_uv + (height - 1) * src_stride_uv;
    src_stride_uv = -src_stride_uv;
  }
  // Coalesce rows.
  if (src_stride_uv == width * 2 && dst_stride_vu == width * 2) {
    width *= height;
    height = 1;
    src_stride_uv = dst_stride_vu = 0;
  }

#if defined(HAS_SWAPUVROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    SwapUVRow = SwapUVRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      SwapUVRow = SwapUVRow_SSSE3;
    }
  }
#endif
#if defined(HAS_SWAPUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SwapUVRow = SwapUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SwapUVRow = SwapUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SWAPUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SwapUVRow = SwapUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SwapUVRow = SwapUVRow_NEON;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    SwapUVRow(src_uv, dst_vu, width);
    src_uv += src_stride_uv;
    dst_vu += dst_stride_vu;
  }
}